

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlbackend.h
# Opt level: O0

bool __thiscall rengine::SDLBackend::beginRender(SDLBackend *this)

{
  ostream *poVar1;
  char *pcVar2;
  bool bVar3;
  string local_40 [36];
  int local_1c;
  SDLBackend *pSStack_18;
  int error;
  SDLBackend *this_local;
  
  pSStack_18 = this;
  if (this->m_window == (SDL_Window *)0x0) {
    __assert_fail("m_window",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0xc9,"virtual bool rengine::SDLBackend::beginRender()");
  }
  if (this->m_surface == (Surface *)0x0) {
    __assert_fail("m_surface",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0xca,"virtual bool rengine::SDLBackend::beginRender()");
  }
  if (this->m_gl == (SDL_GLContext)0x0) {
    __assert_fail("m_gl",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0xcb,"virtual bool rengine::SDLBackend::beginRender()");
  }
  local_1c = SDL_GL_MakeCurrent(this->m_window,this->m_gl);
  bVar3 = local_1c == 0;
  if (!bVar3) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"W [");
    log_timestring_abi_cxx11_();
    poVar1 = std::operator<<(poVar1,local_40);
    poVar1 = std::operator<<(poVar1,"]: ");
    poVar1 = std::operator<<(poVar1,"virtual bool rengine::SDLBackend::beginRender()");
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1,"SDL_GL_MakeCurrent failed: ");
    pcVar2 = (char *)SDL_GetError();
    std::operator<<(poVar1,pcVar2);
    std::__cxx11::string::~string(local_40);
  }
  return bVar3;
}

Assistant:

inline bool SDLBackend::beginRender()
{
    assert(m_window);
    assert(m_surface);
    assert(m_gl);
    int error = SDL_GL_MakeCurrent(m_window, m_gl);
    if (error != 0) {
        logw << "SDL_GL_MakeCurrent failed: " << SDL_GetError();
        return false;
    }
    return true;
}